

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateImportedFileChecksCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations)

{
  ostream *poVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  string targetName;
  string local_d0;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  local_90.View_._M_str = (this->Namespace)._M_dataplus._M_p;
  local_90.View_._M_len = (this->Namespace)._M_string_length;
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_b0,target);
  local_60.View_._M_len = local_b0._M_string_length;
  local_60.View_._M_str = local_b0._M_dataplus._M_p;
  cmStrCat<>(&local_d0,&local_90,&local_60);
  std::__cxx11::string::~string((string *)&local_b0);
  poVar1 = std::operator<<(os,"list(APPEND _cmake_import_check_targets ");
  poVar1 = std::operator<<(poVar1,(string *)&local_d0);
  poVar1 = std::operator<<(poVar1," )\nlist(APPEND _cmake_import_check_files_for_");
  poVar1 = std::operator<<(poVar1,(string *)&local_d0);
  std::operator<<(poVar1," ");
  for (p_Var3 = (importedLocations->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(importedLocations->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&properties->_M_t,(key_type *)(p_Var3 + 1));
    if ((_Rb_tree_header *)cVar2._M_node != &(properties->_M_t)._M_impl.super__Rb_tree_header) {
      cmExportFileGeneratorEscape((string *)&local_90,(string *)(cVar2._M_node + 2));
      poVar1 = std::operator<<(os,(string *)&local_90);
      std::operator<<(poVar1," ");
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  std::operator<<(os,")\n\n");
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportedFileChecksCode(
  std::ostream& os, cmGeneratorTarget* target,
  ImportPropertyMap const& properties,
  const std::set<std::string>& importedLocations)
{
  // Construct the imported target name.
  std::string targetName = cmStrCat(this->Namespace, target->GetExportName());

  os << "list(APPEND _cmake_import_check_targets " << targetName
     << " )\n"
        "list(APPEND _cmake_import_check_files_for_"
     << targetName << " ";

  for (std::string const& li : importedLocations) {
    auto pi = properties.find(li);
    if (pi != properties.end()) {
      os << cmExportFileGeneratorEscape(pi->second) << " ";
    }
  }

  os << ")\n\n";
}